

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.c
# Opt level: O3

void apx_connectionManager_attach(apx_connectionManager_t *self,apx_serverConnection_t *connection)

{
  adt_u32Set_t *self_00;
  _Bool _Var1;
  uint32_t uVar2;
  
  if (connection == (apx_serverConnection_t *)0x0 || self == (apx_connectionManager_t *)0x0) {
    return;
  }
  pthread_spin_lock(&self->lock);
  self_00 = &self->connection_id_set;
  _Var1 = adt_u32Set_contains(self_00,self->next_connection_id);
  if (_Var1) {
    do {
      uVar2 = self->next_connection_id + 1;
      if (uVar2 == 0xffffffff) {
        uVar2 = 0;
      }
      self->next_connection_id = uVar2;
      _Var1 = adt_u32Set_contains(self_00,uVar2);
    } while (_Var1);
  }
  adt_u32Set_insert(self_00,self->next_connection_id);
  uVar2 = self->next_connection_id;
  adt_list_insert_unique(&self->active_connections,connection);
  pthread_spin_unlock(&self->lock);
  apx_serverConnection_set_connection_id(connection,uVar2);
  apx_serverConnection_connected_notification(connection);
  return;
}

Assistant:

void apx_connectionManager_attach(apx_connectionManager_t *self, apx_serverConnection_t *connection)
{
   if ( (self != 0) && (connection != 0) )
   {
      uint32_t connection_id;
      SPINLOCK_ENTER(self->lock);
      connection_id = apx_connectionManager_generate_connection_id(self);
      adt_list_insert_unique(&self->active_connections, connection);
      SPINLOCK_LEAVE(self->lock);
      apx_serverConnection_set_connection_id(connection, connection_id);
      apx_serverConnection_connected_notification(connection);
#if (APX_DEBUG_ENABLE)
      printf("[CONNECTION-MANAGER] New connection %d\n", (int)connection_id);
#endif
   }
}